

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::M_formatter<spdlog::details::null_scoped_padder>::format
          (M_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args;
  ulong local_58 [3];
  buffer<char> local_40;
  memory_buf_t *local_20;
  
  uVar1 = tm_time->tm_min;
  local_58[0] = (ulong)uVar1;
  if (local_58[0] < 100) {
    bVar2 = (byte)((uVar1 & 0xff) / 10);
    sVar3 = (dest->super_buffer<char>).size_;
    uVar4 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar4 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar3] = bVar2 | 0x30;
    sVar3 = (dest->super_buffer<char>).size_;
    uVar4 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar4) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar4 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar4;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + bVar2 * -10 | 0x30;
  }
  else {
    local_40.size_ = (dest->super_buffer<char>).size_;
    local_40._vptr_buffer = (_func_int **)&PTR_grow_001c5890;
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_58;
    args.desc_ = 1;
    local_40.capacity_ = local_40.size_;
    local_20 = dest;
    ::fmt::v8::detail::vformat_to<char>(&local_40,fmt,args,(locale_ref)0x0);
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad2(tm_time.tm_min, dest);
    }